

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

live_range_t_conflict
create_live_range(gen_ctx_t gen_ctx,int start,int finish,live_range_t_conflict next)

{
  live_range_t_conflict plVar1;
  
  plVar1 = gen_ctx->lr_ctx->free_lr_list;
  if (plVar1 == (live_range_t_conflict)0x0) {
    plVar1 = (live_range_t_conflict)malloc(0x20);
    if (plVar1 == (live_range_t_conflict)0x0) {
      util_error(gen_ctx,"no memory");
    }
  }
  else {
    gen_ctx->lr_ctx->free_lr_list = plVar1->next;
  }
  if (-1 < start) {
    if ((uint)start <= (uint)finish) {
      plVar1->start = start;
      plVar1->finish = finish;
      plVar1->ref_cost = 1;
      plVar1->next = next;
      plVar1->lr_bb = (lr_bb_t_conflict)0x0;
      return plVar1;
    }
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  __assert_fail("start >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
}

Assistant:

static live_range_t create_live_range (gen_ctx_t gen_ctx, int start, int finish,
                                       live_range_t next) {
  live_range_t lr;
  if ((lr = free_lr_list) != NULL) {
    free_lr_list = free_lr_list->next;
  } else {
    lr = gen_malloc (gen_ctx, sizeof (struct live_range));
  }
  gen_assert (start >= 0);
  gen_assert (finish < 0 || start <= finish);
  lr->start = start;
  lr->finish = finish;
  lr->ref_cost = 1;
  lr->next = next;
  lr->lr_bb = NULL;
  return lr;
}